

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# update.c
# Opt level: O3

void char_update(void)

{
  long *plVar1;
  byte *pbVar2;
  undefined2 uVar3;
  uint uVar4;
  CHAR_DATA *pCVar5;
  ROOM_INDEX_DATA *pRVar6;
  PC_DATA *pPVar7;
  AFFECT_DATA *pAVar8;
  bool bVar9;
  byte bVar10;
  float fVar11;
  bool bVar12;
  short sVar13;
  int iVar14;
  int iVar15;
  OBJ_DATA *obj;
  CClass *pCVar16;
  ushort uVar17;
  CHAR_DATA *pCVar18;
  char *pcVar19;
  CProficiencies *this;
  AFFECT_DATA *paf;
  CHAR_DATA *pCVar20;
  string_view fmt;
  char buf1 [4608];
  
  bVar9 = 1 < save_number;
  save_number = save_number + 1;
  if (bVar9) {
    save_number = 0;
  }
  if (char_list != (CHAR_DATA *)0x0) {
    bVar9 = false;
    pCVar20 = char_list;
    do {
      pCVar5 = pCVar20->next;
      bVar12 = is_npc(pCVar20);
      if (((((!bVar12) || (1 < (ushort)(sun - 1U))) || (pCVar20->in_room == (ROOM_INDEX_DATA *)0x0))
          || ((iVar14 = number_percent(), 0x59 < iVar14 ||
              (bVar12 = is_affected_by(pCVar20,0x11), bVar12)))) ||
         (pCVar20->fighting != (CHAR_DATA *)0x0)) {
        bVar12 = is_npc(pCVar20);
        if (((bVar12) && (2 < sun)) &&
           ((pCVar20->in_room != (ROOM_INDEX_DATA *)0x0 &&
            ((iVar14 = number_percent(), iVar14 < 0x5a && (pCVar20->fighting == (CHAR_DATA *)0x0))))
           )) {
          if (((pCVar20->act[0] & 0x80000000) == 0) ||
             (bVar12 = is_affected_by(pCVar20,0x1e), !bVar12)) {
            bVar10 = (byte)pCVar20->act[1] & 1;
            goto joined_r0x002c1acc;
          }
          goto LAB_002c1ffc;
        }
      }
      else if (((pCVar20->act[1] & 1) == 0) || (bVar12 = is_affected_by(pCVar20,0x1e), !bVar12)) {
        bVar10 = *(byte *)((long)pCVar20->act + 3) & 0x80;
joined_r0x002c1acc:
        if ((bVar10 != 0) && (bVar12 = is_affected_by(pCVar20,0x1e), !bVar12)) {
          pbVar2 = (byte *)((long)pCVar20->affected_by + 3);
          *pbVar2 = *pbVar2 | 0x40;
        }
      }
      else {
LAB_002c1ffc:
        pbVar2 = (byte *)((long)pCVar20->affected_by + 3);
        *pbVar2 = *pbVar2 & 0xbf;
      }
      if (0 < pCVar20->pause) {
        pCVar20->pause = pCVar20->pause + -1;
      }
      bVar12 = is_npc(pCVar20);
      if (((bVar12) && (pCVar20->hit < 0)) && (pCVar20->in_room != (ROOM_INDEX_DATA *)0x0)) {
        fmt._M_str = "{} in {} has HP {}";
        fmt._M_len = 0x12;
        CLogger::Warn<char*&,short&,int&>
                  ((CLogger *)&RS.field_0x140,fmt,&pCVar20->name,&pCVar20->in_room->vnum,
                   &pCVar20->hit);
      }
      sVar13 = pCVar20->ghost;
      if (0 < sVar13) {
        pCVar20->ghost = sVar13 + -1;
        if (sVar13 == 1) {
          pcVar19 = "You are no longer a ghost.\n\r";
        }
        else {
          pcVar19 = "Your body starts to collect itself.\n\r";
          if (sVar13 != 5) {
            if (sVar13 != 3) goto LAB_002c1719;
            pcVar19 = "Your body begins to solidify.\n\r";
          }
        }
        send_to_char(pcVar19,pCVar20);
      }
LAB_002c1719:
      if (0 < pCVar20->bounty_timer) {
        pCVar20->bounty_timer = pCVar20->bounty_timer + -1;
      }
      if (0 < pCVar20->ghost) {
        bVar9 = true;
      }
      bVar12 = is_npc(pCVar20);
      if (((!bVar12) && (sVar13 = pCVar20->level, sVar13 < 0x14)) &&
         ((ushort)(pCVar20->in_room->vnum + 0x9fe8U) < 0xff9c)) {
        do {
          pCVar20->level = sVar13 + 1;
          advance_level(pCVar20,true);
          sVar13 = pCVar20->level;
        } while (sVar13 < 0x14);
        iVar14 = exp_per_level(pCVar20);
        pCVar20->exp = (pCVar20->level + -1) * iVar14;
        colorconv(buf1,"{RYou feel more experienced as you depart the Adventurer\'s Academy!{x\n\r",
                  pCVar20);
        send_to_char(buf1,pCVar20);
        colorconv(buf1,"{GYou are now level 20.{x\n\r",pCVar20);
        send_to_char(buf1,pCVar20);
        if (pCVar20->pet != (CHAR_DATA *)0x0) {
          sprintf(buf1,
                  "Remember, you can ask your familiar questions.  For example, \'say %s, how do I get to my guild?\'.\n\r"
                  ,pCVar20->pet->short_descr);
          send_to_char(buf1,pCVar20);
        }
      }
      bVar12 = is_npc(pCVar20);
      if (!bVar12) {
        if (pCVar20->pcdata == (PC_DATA *)0x0) {
          this = &prof_none;
        }
        else {
          this = &pCVar20->pcdata->profs;
        }
        CProficiencies::UpdateProfPoints(this);
      }
      bVar12 = is_affected_by(pCVar20,0x11);
      if (((!bVar12) && (bVar12 = is_affected(pCVar20,(int)gsn_bleeding), bVar12)) &&
         (pCVar20->position == 4)) {
        pCVar20->position = 8;
      }
      if (pCVar20->position < 3) {
LAB_002c195e:
        damage_new(pCVar20,pCVar20,2,(int)gsn_bleeding,0x13,true,false,0,1,"slow bleeding");
      }
      else {
        iVar14 = (int)pCVar20->max_hit;
        if (pCVar20->hit < iVar14) {
          iVar14 = hit_gain(pCVar20);
          iVar14 = iVar14 + pCVar20->hit;
        }
        pCVar20->hit = iVar14;
        sVar13 = pCVar20->max_mana;
        if (pCVar20->mana < sVar13) {
          iVar14 = mana_gain(pCVar20);
          sVar13 = (short)iVar14 + pCVar20->mana;
        }
        pCVar20->mana = sVar13;
        sVar13 = pCVar20->max_move;
        if (pCVar20->move < sVar13) {
          bVar12 = is_affected(pCVar20,(int)gsn_repose);
          iVar14 = move_gain(pCVar20);
          sVar13 = (short)(iVar14 << bVar12) + pCVar20->move;
        }
        pCVar20->move = sVar13;
        sVar13 = pCVar20->position;
        if (sVar13 == 3) {
          update_pos(pCVar20);
          sVar13 = pCVar20->position;
        }
        if (sVar13 < 3) goto LAB_002c195e;
      }
      fVar11 = pCVar20->talismanic + -0.0625;
      if (fVar11 <= 0.0) {
        fVar11 = 0.0;
      }
      pCVar20->talismanic = fVar11;
      bVar12 = is_npc(pCVar20);
      if ((!bVar12) && (pRVar6 = pCVar20->in_room, pRVar6 != (ROOM_INDEX_DATA *)0x0)) {
        pPVar7 = pCVar20->pcdata;
        plVar1 = pPVar7->sect_time;
        *plVar1 = *plVar1 + 1;
        plVar1 = pPVar7->sect_time + pRVar6->sector_type;
        *plVar1 = *plVar1 + 1;
      }
      bVar12 = is_npc(pCVar20);
      if (!bVar12) {
        sVar13 = pCVar20->pcdata->save_timer;
        if (sVar13 != 0) {
          pCVar20->pcdata->save_timer = sVar13 + -1;
        }
      }
      bVar12 = is_npc(pCVar20);
      if (bVar12) {
LAB_002c1bb3:
        bVar12 = is_npc(pCVar20);
        if ((bVar12) || (pCVar20->desc != (DESCRIPTOR_DATA *)0x0)) {
          pAVar8 = pCVar20->affected;
LAB_002c1bd4:
          while( true ) {
            paf = pAVar8;
            if ((paf == (AFFECT_DATA *)0x0) ||
               ((pAVar8 = paf->next, !bVar9 && (0 < pCVar20->ghost)))) goto LAB_002c1f41;
            if (paf->duration < 1) break;
            if (paf->tick_fun != (AFF_FUN *)0x0) {
              (*paf->tick_fun)(pCVar20,paf);
            }
            if ((!bVar9) && (0 < pCVar20->ghost)) goto LAB_002c1f41;
            paf->duration = paf->duration + -1;
            iVar14 = number_range(0,4);
            if ((iVar14 == 0) && (0 < paf->level)) {
              paf->level = paf->level + -1;
            }
          }
          if (-1 < paf->duration) {
            pCVar18 = paf->owner;
            if (paf->type == gsn_entwine) {
              if ((pCVar18 != (CHAR_DATA *)0x0) && (pCVar20->in_room == pCVar18->in_room)) {
LAB_002c1cbe:
                pCVar16 = pCVar18->my_class;
                if ((pCVar16 == (CClass *)0x0) &&
                   ((pCVar18->pIndexData == (MOB_INDEX_DATA *)0x0 ||
                    (pCVar16 = pCVar18->pIndexData->my_class, pCVar16 == (CClass *)0x0)))) {
                  pCVar16 = CClass::GetClass(0);
                }
                iVar14 = CClass::GetIndex(pCVar16);
                if (iVar14 == 4) goto LAB_002c1d52;
                if (paf->owner == (CHAR_DATA *)0x0) goto LAB_002c1cfe;
                goto LAB_002c1e16;
              }
            }
            else {
              if (pCVar18 != (CHAR_DATA *)0x0) goto LAB_002c1cbe;
LAB_002c1cfe:
              pCVar16 = pCVar20->my_class;
              if ((pCVar16 == (CClass *)0x0) &&
                 ((pCVar20->pIndexData == (MOB_INDEX_DATA *)0x0 ||
                  (pCVar16 = pCVar20->pIndexData->my_class, pCVar16 == (CClass *)0x0)))) {
                pCVar16 = CClass::GetClass(0);
              }
              iVar14 = CClass::GetIndex(pCVar16);
              if (iVar14 == 4) {
                pCVar18 = paf->owner;
                if (paf->owner == (CHAR_DATA *)0x0) {
                  pCVar18 = pCVar20;
                }
                bVar12 = trusts(pCVar20,pCVar18);
                if (bVar12) {
LAB_002c1d52:
                  if (paf->aftype == 4) {
                    iVar14 = number_percent();
                    pCVar18 = paf->owner;
                    if (paf->owner == (CHAR_DATA *)0x0) {
                      pCVar18 = pCVar20;
                    }
                    iVar15 = get_skill(pCVar18,(int)gsn_channeling);
                    if (((double)iVar14 < (double)iVar15 * 0.85) &&
                       ((skill_table[paf->type].dispel & 4) == 0)) {
                      pCVar18 = paf->owner;
                      if (paf->owner == (CHAR_DATA *)0x0) {
                        pCVar18 = pCVar20;
                      }
                      check_improve(pCVar18,(int)gsn_channeling,true,1);
                      pCVar18 = paf->owner;
                      if (pCVar18 == (CHAR_DATA *)0x0 || pCVar20 == pCVar18) {
                        pcVar19 = 
                        "You feel invigorated as your $t supplication is renewed by your deity.";
                        pCVar18 = (CHAR_DATA *)0x0;
                      }
                      else {
                        pcVar19 = "You feel invigorated as $N renews your $t supplication.";
                      }
                      act(pcVar19,pCVar20,skill_table[paf->type].name,pCVar18,3);
                      paf->duration = paf->init_duration;
                      iVar14 = (int)pCVar20->mana - (int)skill_table[paf->type].min_mana;
                      sVar13 = (short)iVar14;
                      if (iVar14 < 1) {
                        sVar13 = 0;
                      }
                      pCVar20->mana = sVar13;
                      goto LAB_002c1bd4;
                    }
                  }
                }
              }
LAB_002c1e16:
              uVar17 = paf->type;
              if (((pAVar8 == (AFFECT_DATA *)0x0) || (pAVar8->type != uVar17)) ||
                 (0 < pAVar8->duration)) {
                if (0 < (short)uVar17) {
                  bVar12 = str_cmp(*(char **)((long)skill_table[0].skill_level +
                                             (ulong)(((uint)uVar17 + (uint)uVar17 * 2) * 0x20) +
                                             0x40),"");
                  uVar17 = paf->type;
                  if (bVar12) {
                    send_to_char(skill_table[(short)uVar17].msg_off,pCVar20);
                    send_to_char("\n\r",pCVar20);
                    uVar17 = paf->type;
                  }
                }
                if (((uVar17 != 0) &&
                    (bVar12 = str_cmp(skill_table[(short)uVar17].room_msg_off,""), bVar12)) &&
                   (bVar12 = is_awake(pCVar20), bVar12)) {
                  act(skill_table[paf->type].room_msg_off,pCVar20,(void *)0x0,(void *)0x0,0);
                }
              }
            }
            affect_remove(pCVar20,paf);
            goto LAB_002c1bd4;
          }
          if (paf->tick_fun != (AFF_FUN *)0x0) {
            (*paf->tick_fun)(pCVar20,paf);
          }
          if ((bVar9) || (pCVar20->ghost < 1)) goto LAB_002c1bd4;
        }
LAB_002c1f41:
        if ((((bVar9) || (pCVar20->ghost < 1)) && (bVar12 = is_npc(pCVar20), !bVar12)) &&
           ((pCVar20->in_room != (ROOM_INDEX_DATA *)0x0 && (pCVar20->in_room->sector_type == 0xd))))
        {
          iVar14 = dice((int)(short)(pCVar20->level - (pCVar20->level >> 0xf)) >> 1,2);
          damage_new(pCVar20,pCVar20,iVar14,(int)gsn_bleeding,4,true,false,0,1,"the searing heat*");
        }
      }
      else {
        obj = get_eq_char(pCVar20,0);
        if (((obj != (OBJ_DATA *)0x0) && (obj->item_type == 1)) &&
           (uVar4 = obj->value[2], 0 < (int)uVar4)) {
          obj->value[2] = uVar4 - 1;
          if (uVar4 - 1 == 0) {
            pRVar6 = pCVar20->in_room;
            if (pRVar6 != (ROOM_INDEX_DATA *)0x0) {
              sVar13 = pRVar6->light;
              if (sVar13 < 4) {
                sVar13 = 3;
              }
              pRVar6->light = sVar13 + -3;
              act("$p goes out.",pCVar20,obj,(void *)0x0,0);
              act("$p flickers and goes out.",pCVar20,obj,(void *)0x0,3);
              extract_obj(obj);
            }
          }
          else if ((uVar4 < 7) && (pCVar20->in_room != (ROOM_INDEX_DATA *)0x0)) {
            act("$p flickers.",pCVar20,obj,(void *)0x0,3);
          }
        }
        uVar3 = pCVar20->timer;
        pCVar20->timer = uVar3 + 1;
        if ((((short)(uVar3 + 1) < 0x19) || (bVar12 = is_heroimm(pCVar20), bVar12)) ||
           ((bVar12 = is_immortal(pCVar20), bVar12 ||
            ((((pCVar20->act[0] & 0x8000) != 0 || (pCVar20->was_in_room != (ROOM_INDEX_DATA *)0x0))
             || (pCVar20->in_room == (ROOM_INDEX_DATA *)0x0)))))) {
          gain_condition(pCVar20,0,-1);
          gain_condition(pCVar20,2,1);
          gain_condition(pCVar20,3,1);
          goto LAB_002c1bb3;
        }
        pCVar20->was_in_room = pCVar20->in_room;
        if (pCVar20->fighting != (CHAR_DATA *)0x0) {
          stop_fighting(pCVar20,true);
        }
        act("$n disappears into the void.",pCVar20,(void *)0x0,(void *)0x0,0);
        send_to_char("You disappear into the void.\n\r",pCVar20);
        if (1 < pCVar20->level) {
          save_char_obj(pCVar20);
        }
        pCVar20->pause = 0;
        do_quit_new(pCVar20,"",true);
      }
      pCVar20 = pCVar5;
      pCVar18 = char_list;
    } while (pCVar5 != (CHAR_DATA *)0x0);
    while (pCVar20 = pCVar18, pCVar20 != (CHAR_DATA *)0x0) {
      pCVar18 = pCVar20->next;
      if ((pCVar20->desc != (DESCRIPTOR_DATA *)0x0) &&
         (save_number == pCVar20->desc->descriptor % 3)) {
        save_char_obj(pCVar20);
      }
    }
  }
  return;
}

Assistant:

void char_update(void)
{
	CHAR_DATA *ch;
	CHAR_DATA *ch_next;
	CHAR_DATA *ch_quit;
	int hgain;
	bool ghost= false;

	ch_quit = nullptr;

	/* update save counter */
	save_number++;

	if (save_number > 2)
		save_number = 0;

	for (ch = char_list; ch != nullptr; ch = ch_next)
	{
		CHAR_DATA *master;
		AFFECT_DATA *paf;
		AFFECT_DATA *paf_next;
		bool charm_gone;

		ch_next = ch->next;
		master = nullptr;

		if (is_npc(ch)
			&& (sun == SolarPosition::Sunrise || sun == SolarPosition::Daylight)
			&& ch->in_room
			&& number_percent() < 90
			&& !is_affected_by(ch, AFF_SLEEP)
			&& ch->fighting == nullptr)
		{
			if (IS_SET(ch->act, ACT_DIURNAL) && is_affected_by(ch, AFF_NOSHOW))
				REMOVE_BIT(ch->affected_by, AFF_NOSHOW);
			else if (IS_SET(ch->act, ACT_NOCTURNAL) && !is_affected_by(ch, AFF_NOSHOW))
				SET_BIT(ch->affected_by, AFF_NOSHOW);
		}
		else if (is_npc(ch) && sun >= SolarPosition::Sunset && ch->in_room && number_percent() < 90 && ch->fighting == nullptr)
		{
			if (IS_SET(ch->act, ACT_NOCTURNAL) && is_affected_by(ch, AFF_NOSHOW))
				REMOVE_BIT(ch->affected_by, AFF_NOSHOW);
			else if (IS_SET(ch->act, ACT_DIURNAL) && !is_affected_by(ch, AFF_NOSHOW))
				SET_BIT(ch->affected_by, AFF_NOSHOW);
		}

		if (ch->pause > 0)
			ch->pause--;

		if (is_npc(ch) && ch->hit < 0 && ch->in_room)
		{
			RS.Logger.Warn("{} in {} has HP {}", ch->name, ch->in_room->vnum, ch->hit);
		}

		if (ch->ghost > 0)
		{
			ch->ghost--;

			switch (ch->ghost)
			{
				case 4:
					send_to_char("Your body starts to collect itself.\n\r", ch);
					break;
				case 2:
					send_to_char("Your body begins to solidify.\n\r", ch);
					break;
				case 0:
					send_to_char("You are no longer a ghost.\n\r", ch);
					break;
			}
		}

		if (ch->bounty_timer > 0)
			ch->bounty_timer--;

		if (ch->ghost > 0)
			ghost = true;

		/* LOWBIE LEVELLING */
		if (!is_npc(ch) && ch->level < 20 && (ch->in_room->vnum > 24599 || ch->in_room->vnum < 24500))
		{
			char buf1[MSL];
			while (ch->level < 20)
			{
				ch->level++;
				advance_level(ch, true);
			}

			ch->exp = exp_per_level(ch) * (ch->level - 1);

			colorconv(buf1, "{RYou feel more experienced as you depart the Adventurer's Academy!{x\n\r", ch);
			send_to_char(buf1, ch);

			colorconv(buf1, "{GYou are now level 20.{x\n\r", ch);
			send_to_char(buf1, ch);

			if (ch->pet)
			{
				sprintf(buf1, "Remember, you can ask your familiar questions.  For example, 'say %s, how do I get to my guild?'.\n\r", ch->pet->short_descr);
				send_to_char(buf1, ch);
			}
		}

		if (!is_npc(ch))
			ch->Profs()->UpdateProfPoints();

		if (!is_affected_by(ch, AFF_SLEEP) && is_affected(ch, gsn_bleeding) && ch->position == POS_SLEEPING)
			ch->position = POS_STANDING;

		if (ch->position >= POS_STUNNED)
		{
			if (ch->hit < ch->max_hit) /* Some regen stuff */
			{
				hgain = hit_gain(ch);
				ch->hit += hgain;
			}
			else
			{
				ch->hit = ch->max_hit;
			}

			if (ch->mana < ch->max_mana)
				ch->mana += mana_gain(ch);
			else
				ch->mana = ch->max_mana;

			if (ch->move < ch->max_move)
				ch->move += (is_affected(ch, gsn_repose)) ? (move_gain(ch) * 2) : (move_gain(ch));
			else
				ch->move = ch->max_move;
		}

		if (ch->position == POS_STUNNED)
			update_pos(ch);

		if (ch->position < POS_STUNNED)
			damage_new(ch, ch, 2, gsn_bleeding, DAM_TRUESTRIKE, true, HIT_UNBLOCKABLE, HIT_NOADD, HIT_NOMULT, "slow bleeding");

		ch->talismanic = std::max((double)0, ch->talismanic - 0.0625);

		if (!is_npc(ch) && ch->in_room)
		{
			ch->pcdata->sect_time[0]++;
			ch->pcdata->sect_time[ch->in_room->sector_type]++;
		}

		if (!is_npc(ch) && ch->pcdata->save_timer)
			ch->pcdata->save_timer--;

		if (!is_npc(ch) /* && !is_immortal(ch) */)
		{
			OBJ_DATA *obj;

			if ((obj = get_eq_char(ch, WEAR_LIGHT)) != nullptr && obj->item_type == ITEM_LIGHT && obj->value[2] > 0)
			{
				if (--obj->value[2] == 0 && ch->in_room != nullptr)
				{
					ch->in_room->light = std::max(0, ch->in_room->light - 3);
					act("$p goes out.", ch, obj, nullptr, TO_ROOM);
					act("$p flickers and goes out.", ch, obj, nullptr, TO_CHAR);
					extract_obj(obj);
				}
				else if (obj->value[2] <= 5 && ch->in_room != nullptr)
				{
					act("$p flickers.", ch, obj, nullptr, TO_CHAR);
				}
			}

			ch->timer++;

			if (ch->timer >= 25 && !is_heroimm(ch) && !is_immortal(ch) && !IS_SET(ch->act, PLR_NOVOID))
			{
				if (ch->was_in_room == nullptr && ch->in_room != nullptr)
				{
					ch->was_in_room = ch->in_room;

					if (ch->fighting != nullptr)
						stop_fighting(ch, true);

					act("$n disappears into the void.", ch, nullptr, nullptr, TO_ROOM);
					send_to_char("You disappear into the void.\n\r", ch);

					if (ch->level > 1)
						save_char_obj(ch);

					ch->pause = 0;
					do_quit_new(ch, "", true);
					continue;
				}
			}

			gain_condition(ch, COND_DRUNK, -1);
			gain_condition(ch, COND_THIRST, 1);
			gain_condition(ch, COND_HUNGER, 1);
		}

		if (!is_npc(ch) && ch->desc == nullptr)
		{
			/* nothing */
		}
		else
		{
			for (paf = ch->affected; paf != nullptr; paf = paf_next)
			{
				paf_next = paf->next;
				charm_gone= false;

				if (!ghost && ch->ghost > 0)
					break;

				if (paf->duration > 0)
				{
					if (paf->tick_fun)
						(*paf->tick_fun)(ch, paf);

					if (!ch || (!ghost && ch->ghost > 0))
						break;

					if (!paf)
						continue;

					paf->duration--;

					if (number_range(0, 4) == 0 && paf->level > 0)
						paf->level--; /* spell strength fades with time */
				}
				else if (paf->duration < 0)
				{
					if (paf->tick_fun)
						(*paf->tick_fun)(ch, paf);

					if (!ghost && ch->ghost > 0)
						break;
				}
				else if (paf->type == gsn_entwine
					&& (paf->owner == nullptr || (paf->owner && ch->in_room != paf->owner->in_room)))
				{
					affect_remove(ch, paf);
				}
				else
				{
					if (((paf->owner && paf->owner->Class()->GetIndex() == CLASS_PALADIN)
							|| (!paf->owner && ch->Class()->GetIndex() == CLASS_PALADIN)
							&& trusts(ch, paf->owner ? paf->owner : ch))
						&& paf->aftype == AFT_COMMUNE)
					{
						if (number_percent() < (get_skill(paf->owner ? paf->owner : ch, gsn_channeling) * .85)
							&& !(skill_table[paf->type].dispel & CAN_CLEANSE))
						{
							check_improve(paf->owner ? paf->owner : ch, gsn_channeling, true, 1);

							if (!paf->owner || ch == paf->owner)
							{
								act("You feel invigorated as your $t supplication is renewed by your deity.", ch, skill_table[paf->type].name, 0, TO_CHAR);
							}
							else
							{
								act("You feel invigorated as $N renews your $t supplication.", ch, skill_table[paf->type].name, paf->owner, TO_CHAR);
							}

							paf->duration = paf->init_duration;
							ch->mana = std::max(ch->mana - skill_table[paf->type].min_mana, 0);
							continue;
						}
					}

					if (paf_next == nullptr || paf_next->type != paf->type || paf_next->duration > 0)
					{
						if (paf->type > 0 && str_cmp(skill_table[paf->type].msg_off, ""))
						{
							send_to_char(skill_table[paf->type].msg_off, ch);
							send_to_char("\n\r", ch);
						}

						if (paf->type && str_cmp(skill_table[paf->type].room_msg_off, "") && is_awake(ch))
							act(skill_table[paf->type].room_msg_off, ch, 0, 0, TO_ROOM);
					}
					affect_remove(ch, paf);
				}
			}
		}

		if (!ch)
			continue;

		if (!ghost && ch->ghost > 0)
			continue;

		/*
		 * Careful with the damages here,
		 *   MUST NOT refer to ch after damage taken,
		 *   as it may be lethal damage (on NPC).
		 *
		 *   You must add a line to the poison check in damage_new in fight.c!
		 */

		if (!is_npc(ch) && ch->in_room && ch->in_room->sector_type == SECT_BURNING)
			damage_new(ch, ch, dice(ch->level / 2, 2), gsn_bleeding, DAM_FIRE, true, HIT_UNBLOCKABLE, HIT_NOADD, HIT_NOMULT, "the searing heat*");
	}
	/*
	 * Autosave and autoquit.
	 * Check that these chars still exist.
	 */
	for (ch = char_list; ch != nullptr; ch = ch_next)
	{
		ch_next = ch->next;

		if (ch->desc != nullptr && ch->desc->descriptor % 3 == save_number)
			save_char_obj(ch);
	}
}